

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_test.cpp
# Opt level: O2

void flatbuffers::tests::proto_test_include_union
               (string *proto_path,string *proto_file,string *import_proto_file)

{
  bool expval;
  string golden_file;
  string local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  IDLOptions opts;
  
  IDLOptions::IDLOptions(&opts);
  opts.include_dependence_headers = true;
  opts.proto_mode = true;
  opts.proto_oneof_union = true;
  opts.proto_id_gap_action = NO_OP;
  golden_file._M_dataplus._M_p = (pointer)&golden_file.field_2;
  golden_file._M_string_length = 0;
  golden_file.field_2._M_local_buf[0] = '\0';
  std::operator+(&local_350,proto_path,"test_union_include.golden.fbs");
  expval = LoadFile(local_350._M_dataplus._M_p,false,&golden_file);
  TestEq<bool,bool>(expval,true,
                    "\'flatbuffers::LoadFile( (proto_path + \"test_union_include.golden.fbs\").c_str(), false, &golden_file)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/proto_test.cpp"
                    ,200,"");
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::string((string *)&local_370,(string *)import_proto_file);
  RunTest(&opts,proto_path,proto_file,&golden_file,&local_370);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&golden_file);
  IDLOptions::~IDLOptions(&opts);
  return;
}

Assistant:

void proto_test_include_union(const std::string &proto_path,
                              const std::string &proto_file,
                              const std::string &import_proto_file) {
  flatbuffers::IDLOptions opts;
  opts.include_dependence_headers = true;
  opts.proto_mode = true;
  opts.proto_oneof_union = true;
  opts.proto_id_gap_action = IDLOptions::ProtoIdGapAction::NO_OP;

  std::string golden_file;
  TEST_EQ(flatbuffers::LoadFile(
              (proto_path + "test_union_include.golden.fbs").c_str(), false,
              &golden_file),
          true);

  RunTest(opts, proto_path, proto_file, golden_file, import_proto_file);
}